

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

string __thiscall
mjs::anon_unknown_63::array_to_locale_string
          (anon_unknown_63 *this,gc_heap_ptr<mjs::global_object> *global_,object_ptr *arr)

{
  gc_heap *pgVar1;
  uint32_t uVar2;
  value_type vVar3;
  object *poVar4;
  global_object *pgVar5;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined1 auVar6 [16];
  wstring_view wVar7;
  string sVar8;
  wstring_view local_1e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_1d8;
  value local_1c0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_198;
  value local_188;
  value local_160;
  string local_138;
  wstring_view local_128;
  undefined1 local_118 [8];
  object_ptr o;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  value v;
  undefined1 local_a8 [4];
  uint32_t i;
  gc_heap_ptr<mjs::global_object> global;
  wstring s;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_68;
  value local_58;
  uint32_t local_2c;
  gc_heap *pgStack_28;
  uint32_t len;
  gc_heap *h;
  object_ptr *arr_local;
  gc_heap_ptr<mjs::global_object> *global__local;
  
  h = (gc_heap *)arr;
  arr_local = (object_ptr *)global_;
  global__local = (gc_heap_ptr<mjs::global_object> *)this;
  pgStack_28 = gc_heap_ptr_untyped::heap(&arr->super_gc_heap_ptr_untyped);
  poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)h);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_68,L"length");
  (**poVar4->_vptr_object)(&local_58,poVar4,&local_68);
  uVar2 = to_uint32(&local_58);
  value::~value(&local_58);
  local_2c = uVar2;
  std::__cxx11::wstring::wstring((wstring *)&global.super_gc_heap_ptr_untyped.pos_);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::global_object> *)local_a8,
             (gc_heap_ptr<mjs::global_object> *)arr_local);
  for (v.field_1._28_4_ = 0; pgVar1 = pgStack_28, v.field_1._28_4_ < local_2c;
      v.field_1._28_4_ = v.field_1._28_4_ + 1) {
    if (v.field_1._28_4_ != 0) {
      std::__cxx11::wstring::operator+=((wstring *)&global.super_gc_heap_ptr_untyped.pos_,L",");
    }
    poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)h);
    index_string_abi_cxx11_
              ((wstring *)&o.super_gc_heap_ptr_untyped.pos_,(mjs *)(ulong)(uint)v.field_1._28_4_,
               index);
    auVar6 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                       ((wstring *)&o.super_gc_heap_ptr_untyped.pos_);
    local_e8 = auVar6;
    (**poVar4->_vptr_object)(local_d8,poVar4,local_e8);
    std::__cxx11::wstring::~wstring((wstring *)&o.super_gc_heap_ptr_untyped.pos_);
    vVar3 = value::type((value *)local_d8);
    if (vVar3 != undefined) {
      vVar3 = value::type((value *)local_d8);
      if (vVar3 != null) {
        pgVar5 = gc_heap_ptr<mjs::global_object>::operator->
                           ((gc_heap_ptr<mjs::global_object> *)local_a8);
        (*(pgVar5->super_object)._vptr_object[0x11])(local_118,pgVar5,local_d8);
        pgVar1 = pgStack_28;
        poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_118);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_198,L"toLocaleString");
        (**poVar4->_vptr_object)(&local_188,poVar4,&local_198);
        value::value(&local_1c0,(object_ptr *)local_118);
        local_1d8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_1d8);
        call_function(&local_160,&local_188,&local_1c0,&local_1d8);
        to_string((mjs *)&local_138,pgVar1,&local_160);
        wVar7 = string::view(&local_138);
        local_128 = wVar7;
        std::__cxx11::wstring::operator+=
                  ((wstring *)&global.super_gc_heap_ptr_untyped.pos_,&local_128);
        string::~string(&local_138);
        value::~value(&local_160);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_1d8);
        value::~value(&local_1c0);
        value::~value(&local_188);
        gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_118);
      }
    }
    value::~value((value *)local_d8);
  }
  local_1e8 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view
                        ((wstring *)&global.super_gc_heap_ptr_untyped.pos_);
  string::string((string *)this,pgVar1,&local_1e8);
  gc_heap_ptr<mjs::global_object>::~gc_heap_ptr((gc_heap_ptr<mjs::global_object> *)local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&global.super_gc_heap_ptr_untyped.pos_);
  sVar8.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar8.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar8.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string array_to_locale_string(const gc_heap_ptr<global_object>& global_, const object_ptr& arr) {
    auto& h = arr.heap();
    const uint32_t len = to_uint32(arr->get(L"length"));
    std::wstring s;
    gc_heap_ptr<global_object> global = global_; // Keep local copy since due to use of call_function below (XXX)
    for (uint32_t i = 0; i < len; ++i) {
        if (i) s += L",";
        auto v = arr->get(index_string(i));
        if (v.type() != value_type::undefined && v.type() != value_type::null) {
            auto o = global->to_object(v);
            s += to_string(h, call_function(o->get(L"toLocaleString"), value{o}, {})).view();
        }
    }
    return string{h, s};
}